

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O2

void DeleteAuthCookie(void)

{
  long in_FS_OFFSET;
  path local_40;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (g_generated_cookie == '\x01') {
    GetAuthCookieFile((path *)&local_40,false);
    std::filesystem::remove(&local_40);
    std::filesystem::__cxx11::path::~path(&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DeleteAuthCookie()
{
    try {
        if (g_generated_cookie) {
            // Delete the cookie file if it was generated by this process
            fs::remove(GetAuthCookieFile());
        }
    } catch (const fs::filesystem_error& e) {
        LogPrintf("%s: Unable to remove random auth cookie file: %s\n", __func__, fsbridge::get_filesystem_error_message(e));
    }
}